

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O3

Point3f __thiscall pbrt::detail::Stratified3DIter::operator*(Stratified3DIter *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_ZMM5 [64];
  Point3f PVar14;
  
  iVar1 = (this->super_RNGIterator<pbrt::detail::Stratified3DIter>).
          super_IndexingIterator<pbrt::detail::Stratified3DIter>.i;
  iVar2 = this->nx;
  iVar3 = this->ny;
  uVar7 = (this->super_RNGIterator<pbrt::detail::Stratified3DIter>).rng.state;
  uVar4 = (this->super_RNGIterator<pbrt::detail::Stratified3DIter>).rng.inc;
  uVar6 = uVar7 * 0x5851f42d4c957f2d + uVar4;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar7;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar6;
  auVar12 = vpunpcklqdq_avx(auVar13,auVar10);
  auVar9 = vpsrlvq_avx2(auVar12,_DAT_0054e5c0);
  auVar10 = vpsrlvq_avx2(auVar12,_DAT_0054e5b0);
  auVar12 = vpsrlq_avx(auVar12,0x3b);
  auVar12 = vpshufd_avx(auVar12,0xe8);
  uVar7 = uVar6 * 0x5851f42d4c957f2d + uVar4;
  uVar8 = (uint)(uVar7 >> 0x2d) ^ (uint)(uVar7 >> 0x1b);
  bVar5 = (byte)(uVar7 >> 0x3b);
  auVar11 = vcvtusi2ss_avx512f(in_ZMM5._0_16_,uVar8 >> bVar5 | uVar8 << 0x20 - bVar5);
  (this->super_RNGIterator<pbrt::detail::Stratified3DIter>).rng.state =
       uVar7 * 0x5851f42d4c957f2d + uVar4;
  auVar9 = vpshufd_avx(auVar10 ^ auVar9,0xe8);
  auVar12 = vprorvd_avx512vl(auVar9,auVar12);
  auVar9 = vcvtudq2ps_avx512vl(auVar12);
  auVar12._8_4_ = 0x2f800000;
  auVar12._0_8_ = 0x2f8000002f800000;
  auVar12._12_4_ = 0x2f800000;
  auVar10 = vmulps_avx512vl(auVar9,auVar12);
  auVar9._8_4_ = 0x3f7fffff;
  auVar9._0_8_ = 0x3f7fffff3f7fffff;
  auVar9._12_4_ = 0x3f7fffff;
  uVar7 = vcmpps_avx512vl(auVar10,auVar9,1);
  auVar9 = vminss_avx(ZEXT416((uint)(auVar11._0_4_ * 2.3283064e-10)),SUB6416(ZEXT464(0x3f7fffff),0))
  ;
  auVar12 = vmovshdup_avx(auVar10);
  bVar5 = (byte)(uVar7 >> 1);
  auVar11._0_4_ =
       ((float)((uint)(bVar5 & 1) * auVar12._0_4_ + (uint)!(bool)(bVar5 & 1) * 0x3f7fffff) +
       (float)(iVar1 % iVar2)) / (float)iVar2;
  auVar11._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar12 = vinsertps_avx(auVar11,ZEXT416((uint)(((float)((uint)((byte)uVar7 & 1) * auVar10._0_4_ +
                                                         (uint)!(bool)((byte)uVar7 & 1) * 0x3f7fffff
                                                         ) +
                                                 (float)(int)((long)((ulong)(uint)((int)((long)iVar1
                                                                                        / (long)
                                                  iVar2) >> 0x1f) << 0x20 |
                                                  (long)iVar1 / (long)iVar2 & 0xffffffffU) %
                                                  (long)iVar3)) / (float)iVar3)),0x10);
  PVar14.super_Tuple3<pbrt::Point3,_float>.z =
       (auVar9._0_4_ + (float)(iVar1 / (iVar3 * iVar2))) / (float)this->nz;
  PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar12._0_8_;
  return (Point3f)PVar14.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

PBRT_CPU_GPU
    Point3f operator*() {
        int ix = i % nx;
        int iy = (i / nx) % ny;
        int iz = i / (nx * ny);
        return {(ix + rng.Uniform<Float>()) / nx, (iy + rng.Uniform<Float>()) / ny,
                (iz + rng.Uniform<Float>()) / nz};
    }